

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

reverse_iterator __thiscall JSONNode::rend(JSONNode *this)

{
  JSONNode **ppJVar1;
  JSONNode *in_RSI;
  JSONNode *this_local;
  
  makeUniqueInternal(in_RSI);
  ppJVar1 = internalJSONNode::begin(in_RSI->internal);
  reverse_iterator::reverse_iterator((reverse_iterator *)this,ppJVar1 + -1);
  return (reverse_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::reverse_iterator JSONNode::rend(void) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("rend"));
		  makeUniqueInternal();
		  return JSONNode::reverse_iterator(internal -> begin() - 1);
	   }